

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O0

TiXmlString __thiscall despot::util::tinyxml::operator+(tinyxml *this,TiXmlString *a,char *b)

{
  size_t len;
  size_type sVar1;
  size_type b_len;
  char *b_local;
  TiXmlString *a_local;
  TiXmlString *tmp;
  
  TiXmlString::TiXmlString((TiXmlString *)this);
  len = strlen(b);
  sVar1 = TiXmlString::length(a);
  TiXmlString::reserve((TiXmlString *)this,sVar1 + len);
  TiXmlString::operator+=((TiXmlString *)this,a);
  TiXmlString::append((TiXmlString *)this,b,len);
  return (TiXmlString)(Rep *)this;
}

Assistant:

TiXmlString operator +(const TiXmlString & a, const char* b) {
	TiXmlString tmp;
	TiXmlString::size_type b_len =
		static_cast<TiXmlString::size_type>(strlen(b));
	tmp.reserve(a.length() + b_len);
	tmp += a;
	tmp.append(b, b_len);
	return tmp;
}